

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

unsigned_short __thiscall
IDisk::GetTrackInfoForRev(IDisk *this,int side,int track,Track *track_buffer,int rev)

{
  long lVar1;
  ILog *pIVar2;
  pointer paVar3;
  pointer paVar4;
  undefined8 uVar5;
  uchar uVar6;
  uchar uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  byte bVar14;
  unsigned_short uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ushort uVar19;
  int data_count;
  byte b;
  uint uVar20;
  MFMTrack *pMVar21;
  uint uVar22;
  long lVar23;
  bool bVar24;
  value_type local_b4;
  long local_90;
  int local_84;
  undefined8 local_80;
  Side *local_78;
  Track *local_70;
  ulong local_68;
  ulong local_60;
  CRC crc_local;
  
  local_70 = track_buffer;
  CRC::CRC(&crc_local);
  local_78 = this->side_ + side;
  local_60 = (ulong)track;
  local_68 = (ulong)rev;
  pMVar21 = local_78->tracks;
  local_80 = CONCAT62((int6)((ulong)local_78 >> 0x10),0x100);
  uVar20 = 0;
  local_90 = local_60 << 5;
  lVar12 = local_68 * 0x30;
  local_84 = rev;
LAB_00171202:
  lVar23 = *(long *)((long)&pMVar21->revolution + local_90);
  iVar11 = *(int *)(lVar23 + 8 + lVar12);
  uVar22 = uVar20 - 0x50;
  do {
    if (iVar11 - 0x40U <= uVar20) {
      paVar3 = (local_70->list_sector_).
               super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar4 = (local_70->list_sector_).
               super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar16 = ((long)paVar4 - (long)paVar3) / 0x24;
      if (paVar4 == paVar3) {
        uVar20 = 0;
        uVar15 = (unsigned_short)local_80;
      }
      else {
        iVar11 = 0;
        uVar20 = 0;
        for (uVar22 = 0; uVar18 = (ulong)uVar22, uVar18 < uVar16; uVar22 = uVar22 + 1) {
          if (uVar18 != 0) {
            iVar11 = (iVar11 - uVar20) + paVar3[uVar18].idam_offset + -0x18;
          }
          uVar20 = paVar3[uVar18].index_end;
        }
        local_70->gap3_size_ = (int)((ulong)(long)(iVar11 / 0x10) / uVar16);
        uVar20 = (uint)local_80 + 0x100;
        if ((char)local_80 == '\0') {
          uVar20 = (uint)local_80;
        }
        uVar15 = (unsigned_short)uVar20;
        uVar20 = uVar20 & 0xffff;
      }
      local_70->full_size_ = uVar20;
      CRC::~CRC(&crc_local);
      return uVar15;
    }
    if (0x80 < uVar20) {
      lVar1 = *(long *)(lVar23 + lVar12);
      iVar8 = bcmp(&DAT_001aab80,(void *)((ulong)uVar20 + lVar1),0x40);
      if (iVar8 == 0) {
        bVar13 = true;
        uVar16 = 0;
        uVar9 = uVar22;
        while ((uVar16 < 0x28 && (bVar13))) {
          if ((*(char *)(lVar1 + (ulong)uVar9) == '\x01') &&
             (*(char *)(lVar1 + (ulong)(uVar9 + 1)) == '\0')) {
            bVar13 = true;
          }
          else {
            bVar13 = false;
          }
          uVar16 = uVar16 + 1;
          uVar9 = uVar9 + 2;
        }
        if (bVar13) break;
      }
    }
    uVar20 = uVar20 + 1;
    uVar22 = uVar22 + 1;
  } while( true );
  CRC::Reset(&crc_local);
  CRC::AddByteToCrc(&crc_local,0xa1);
  CRC::AddByteToCrc(&crc_local,0xa1);
  CRC::AddByteToCrc(&crc_local,0xa1);
  CRC::AddByteToCrc(&crc_local,0xfe);
  iVar11 = local_84;
  local_b4.dam_sync_offset = 0;
  local_b4.data_crc_ok = false;
  local_b4._29_3_ = 0;
  local_b4.index_end = 0;
  local_b4.c = '\0';
  local_b4.h = '\0';
  local_b4.r = '\0';
  local_b4.n = '\0';
  local_b4.chrn_crc_ok = false;
  local_b4.status1 = '\0';
  local_b4.status2 = '\0';
  local_b4._15_1_ = 0;
  local_b4.real_size = 0;
  local_b4._18_2_ = 0;
  local_b4.dam_offset = 0;
  local_b4.idam_offset = uVar20;
  local_b4.idam_sync_offset = uVar20 - 0x50;
  uVar6 = GetNextByteForRev(this,side,track,uVar20 + 0x40,local_84);
  local_b4.c = uVar6;
  CRC::AddByteToCrc(&crc_local,uVar6);
  uVar6 = GetNextByteForRev(this,side,track,uVar20 + 0x50,iVar11);
  local_b4.h = uVar6;
  CRC::AddByteToCrc(&crc_local,uVar6);
  uVar6 = GetNextByteForRev(this,side,track,uVar20 + 0x60,iVar11);
  local_b4.r = uVar6;
  CRC::AddByteToCrc(&crc_local,uVar6);
  uVar6 = GetNextByteForRev(this,side,track,uVar20 + 0x70,iVar11);
  local_b4.n = uVar6;
  CRC::AddByteToCrc(&crc_local,uVar6);
  pIVar2 = this->log_;
  if (pIVar2 != (ILog *)0x0) {
    (*(code *)**(undefined8 **)pIVar2)(pIVar2,"Track : ");
    pIVar2 = this->log_;
    if (pIVar2 != (ILog *)0x0) {
      (**(code **)(*(long *)pIVar2 + 8))(pIVar2,local_60 & 0xff);
      pIVar2 = this->log_;
      if (pIVar2 != (ILog *)0x0) {
        (*(code *)**(undefined8 **)pIVar2)(pIVar2," - REV :");
        pIVar2 = this->log_;
        if (pIVar2 != (ILog *)0x0) {
          (**(code **)(*(long *)pIVar2 + 8))(pIVar2,local_68 & 0xff);
          pIVar2 = this->log_;
          if (pIVar2 != (ILog *)0x0) {
            (*(code *)**(undefined8 **)pIVar2)(pIVar2," -> CHRN Found");
            pIVar2 = this->log_;
            if (pIVar2 != (ILog *)0x0) {
              (**(code **)(*(long *)pIVar2 + 8))(pIVar2,local_b4._8_8_ & 0xff);
              pIVar2 = this->log_;
              if (pIVar2 != (ILog *)0x0) {
                (**(code **)(*(long *)pIVar2 + 8))(pIVar2,local_b4.h);
                pIVar2 = this->log_;
                if (pIVar2 != (ILog *)0x0) {
                  (**(code **)(*(long *)pIVar2 + 8))(pIVar2,local_b4.r);
                  pIVar2 = this->log_;
                  if (pIVar2 != (ILog *)0x0) {
                    (**(code **)(*(long *)pIVar2 + 8))(pIVar2,local_b4.n);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  uVar6 = GetNextByteForRev(this,side,track,uVar20 + 0x80,iVar11);
  uVar7 = GetNextByteForRev(this,side,track,uVar20 + 0x90,iVar11);
  lVar23 = local_90;
  uVar5 = local_b4._8_8_;
  if (CONCAT11(uVar6,uVar7) == crc_local.computed_crc_) {
    local_b4.chrn_crc_ok = true;
  }
  else {
    local_b4._8_5_ = CONCAT14(false,local_b4._8_4_);
    local_b4.status1 = SUB81(uVar5,5);
    local_b4._14_2_ = SUB82(uVar5,6);
    local_b4._8_8_ =
         CONCAT26(local_b4._14_2_,CONCAT15(local_b4.status1,local_b4._8_5_)) | 0x200000000000;
    pIVar2 = this->log_;
    if (pIVar2 == (ILog *)0x0) goto LAB_001714e1;
    (*(code *)**(undefined8 **)pIVar2)(pIVar2,"HEADER CRC ERROR !");
  }
  if (this->log_ != (ILog *)0x0) {
    (**(code **)(*(long *)this->log_ + 0x20))();
  }
LAB_001714e1:
  uVar20 = uVar20 + 0xa0;
  bVar13 = false;
LAB_001714ea:
  pMVar21 = local_78->tracks;
  lVar23 = *(long *)((long)&pMVar21->revolution + lVar23);
  iVar11 = *(int *)(lVar23 + 8 + lVar12);
  uVar22 = uVar20 - 0x50;
  do {
    if ((iVar11 - 0x38U <= uVar20) || (bVar13)) goto LAB_00171202;
    lVar1 = *(long *)(lVar23 + lVar12);
    iVar8 = bcmp(&DAT_001aab80,(void *)((ulong)uVar20 + lVar1),0x38);
    if (iVar8 == 0) {
      bVar13 = true;
      lVar17 = 0x28;
      uVar9 = uVar22;
      while( true ) {
        bVar24 = lVar17 == 0;
        lVar17 = lVar17 + -1;
        if (bVar24) break;
        if ((*(char *)(lVar1 + (ulong)uVar9) != '\x01') ||
           (*(char *)(lVar1 + (ulong)(uVar9 + 1)) != '\0')) {
          bVar13 = false;
        }
        uVar9 = uVar9 + 2;
      }
      if (bVar13) break;
    }
    uVar20 = uVar20 + 1;
    uVar22 = uVar22 + 1;
    bVar13 = false;
  } while( true );
  local_b4.dam_offset = uVar20;
  local_b4.dam_sync_offset = uVar20 - 0x50;
  CRC::Reset(&crc_local);
  CRC::AddByteToCrc(&crc_local,0xa1);
  CRC::AddByteToCrc(&crc_local,0xa1);
  CRC::AddByteToCrc(&crc_local,0xa1);
  iVar11 = local_84;
  uVar6 = GetNextByteForRev(this,side,track,uVar20 + 0x30,local_84);
  CRC::AddByteToCrc(&crc_local,uVar6);
  if (this->log_ != (ILog *)0x0) {
    (*(code *)**(undefined8 **)this->log_)();
    if (this->log_ != (ILog *)0x0) {
      (**(code **)(*(long *)this->log_ + 8))();
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 0x20))();
      }
    }
  }
  if (uVar6 == 0xf8) {
    local_b4._8_8_ = local_b4._8_8_ | 0x40000000000000;
  }
  bVar14 = local_b4.n & 7;
  uVar20 = uVar20 + 0x40;
  for (iVar8 = 0; lVar23 = local_90, iVar8 != 0x80 << bVar14; iVar8 = iVar8 + 1) {
    lVar23 = *(long *)((long)&local_78->tracks->revolution + local_90);
    uVar22 = *(uint *)(lVar23 + 8 + lVar12);
    if (uVar20 + 0x10 < uVar22) {
      uVar6 = GetNextByteForRev(this,side,track,uVar20,iVar11);
      CRC::AddByteToCrc(&crc_local,uVar6);
    }
    else {
      b = 0;
      for (uVar9 = 0; uVar9 < 0x10; uVar9 = uVar9 + 2) {
        uVar10 = uVar20 + uVar9;
        if (uVar22 <= uVar10) {
          uVar10 = uVar10 % uVar22;
        }
        b = b * '\x02' | *(byte *)(*(long *)(lVar23 + lVar12) + (long)(int)uVar10) & 1;
      }
      CRC::AddByteToCrc(&crc_local,b);
    }
    local_b4.real_size = local_b4.real_size + 1;
    uVar20 = uVar20 + 0x10;
  }
  lVar1 = *(long *)((long)&local_78->tracks->revolution + local_90);
  uVar22 = *(uint *)(lVar1 + 8 + lVar12);
  if (uVar20 < uVar22 - 0x20) {
    uVar6 = GetNextByteForRev(this,side,track,uVar20,iVar11);
    uVar7 = GetNextByteForRev(this,side,track,uVar20 + 0x10,iVar11);
    uVar19 = CONCAT11(uVar6,uVar7);
    uVar20 = uVar20 + 0x20;
  }
  else {
    uVar19 = 0;
    for (uVar9 = 0; uVar9 < 0x20; uVar9 = uVar9 + 2) {
      uVar10 = uVar20 + uVar9;
      if (uVar22 <= uVar10) {
        uVar10 = uVar10 % uVar22;
      }
      uVar19 = uVar19 * 2 | *(byte *)(*(long *)(lVar1 + lVar12) + (long)(int)uVar10) & 1;
    }
    pIVar2 = this->log_;
    uVar20 = uVar20 + uVar9;
    if (pIVar2 != (ILog *)0x0) {
      (*(code *)**(undefined8 **)pIVar2)(pIVar2,"Track size is too small ?!!");
    }
  }
  if (uVar19 == crc_local.computed_crc_) {
    local_b4.data_crc_ok = true;
  }
  else {
    local_b4._28_8_ = (ulong)(uint7)local_b4._29_7_ << 8;
    local_b4._8_8_ = local_b4._8_8_ | 0x20200000000000;
    pIVar2 = this->log_;
    if (pIVar2 == (ILog *)0x0) goto LAB_001717f0;
    (*(code *)**(undefined8 **)pIVar2)(pIVar2,"DATA CRC ERROR !");
  }
  if (this->log_ != (ILog *)0x0) {
    (**(code **)(*(long *)this->log_ + 0x20))();
  }
LAB_001717f0:
  local_b4.index_end = uVar20;
  lVar1 = *(long *)((long)&local_78->tracks->revolution + lVar23);
  iVar8 = *(int *)(lVar1 + 8 + lVar12);
  uVar15 = local_b4.real_size;
  if (((uVar20 < iVar8 - 0x10U) &&
      (uVar6 = GetNextByteForRev(this,side,track,uVar20,iVar11), uVar15 = local_b4.real_size,
      uVar6 != 'K')) && (uVar6 != 'N')) {
    uVar15 = local_b4.real_size + 2;
    lVar1 = *(long *)(lVar1 + lVar12);
    for (; (iVar11 = bcmp(&DAT_001aab80,(void *)((ulong)uVar20 + lVar1),0x38), iVar11 != 0 &&
           (uVar20 < iVar8 - 0x38U)); uVar20 = uVar20 + 0x10) {
      uVar15 = uVar15 + 1;
    }
  }
  local_b4.real_size = uVar15;
  std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::push_back
            (&local_70->list_sector_,&local_b4);
  local_80 = CONCAT62((int6)((ulong)local_80 >> 0x10),(short)local_80 + local_b4.real_size);
  uVar20 = local_b4.idam_offset + 0x41;
  bVar13 = true;
  goto LAB_001714ea;
}

Assistant:

unsigned short IDisk::GetTrackInfoForRev(int side, int track, Track* track_buffer, int rev)
{
   unsigned short size;
   CRC crc_local;
   // Compute size of track :
   // Header
   size = 256;

   unsigned int index = 0;
   // States :
   // 0 - waiting for next sector id
   // 1 - waiting for next sector data
   // 2 - waiting for end of datas

   // A1 = 4489, FE =
   const char pattern_fe[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 0
   };
   const char pattern_f[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1
   };

   while (index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_fe))
   {
      // Test the pervious 8 bytes (should be '00')
      bool sync_ok = (index > 8 * 16);

      if (sync_ok)
      {
         sync_ok = (memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                           sizeof(pattern_fe)) == 0);
         if (sync_ok)
         {
            for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
            {
               if (side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                  || side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0)
               {
                  sync_ok = false;
               }
            }
         }
      }
      if (sync_ok)
      {
         // Found ! New sector
         crc_local.Reset();
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xFE);

         Sector sector;
         memset(&sector, 0, sizeof(sector));
         // Keep the offset position !
         sector.idam_offset = index;
         sector.idam_sync_offset = index - SYNC_BIT_NUMBER * 2;

         // Adding CHRN to the next sector
         index += sizeof(pattern_fe);

         sector.c = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.c);
         index += 16;
         sector.h = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.h);
         index += 16;
         sector.r = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.r);
         index += 16;
         sector.n = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.n);
         index += 16;

         LOG("Track : ");
         LOGB(track);
         LOG(" - REV :");
         LOGB(rev);
         LOG(" -> CHRN Found");
         LOGB(sector.c);
         LOGB(sector.h);
         LOGB(sector.r);
         LOGB(sector.n);

         // Do we have CRC error ?
         unsigned short crc = GetNextByteForRev(side, track, index, rev);
         crc <<= 8;
         index += 16;
         crc |= GetNextByteForRev(side, track, index, rev);
         index += 16;

         // Set status 1
         if (crc != crc_local.GetCRC())
         {
            sector.chrn_crc_ok = false;
            sector.status1 |= 0x20;
            LOG("HEADER CRC ERROR !");
         }
         else
         {
            sector.chrn_crc_ok = true;
         }
         LOGEOL
         // Now, waiting for A1A1A1F8/B
         bool data_found = false;
         while ((index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_f)) && (!data_found))
         {
            bool data_ok = (memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                                   sizeof(pattern_f)) == 0);

            if (data_ok)
            {
               for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
               {
                  if (side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                     || side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0
                  )
                  {
                     data_ok = false;
                  }
               }
            }

            if (data_ok)
            {
               data_found = true;
               // Keep the offset position
               sector.dam_offset = index;
               sector.dam_sync_offset = index - SYNC_BIT_NUMBER * 2;

               // Yeah
               index += sizeof(pattern_f) - 8;

               // Set the Status according to the F8/FB
               crc_local.Reset();
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               unsigned char byte = GetNextByteForRev(side, track, index, rev);
               crc_local.AddByteToCrc(byte);
               LOG(" DATA FOUND : A1A1A1-");
               LOGB(byte);
               LOGEOL

               index += 16;

               if (byte == 0xF8) // Erased
               {
                  sector.status2 |= 0x40;
               }

               // Now, gather datas...
               int sizeMaxSector = (sector.n & 0x7);
               for (int data_count = 0; data_count < (0x80 << sizeMaxSector); data_count++)
               {
                  if (index + 16 < side_[side].tracks[track].revolution[rev].size)
                  {
                     byte = GetNextByteForRev(side, track, index, rev);
                     crc_local.AddByteToCrc(byte);
                     sector.real_size++;
                     index += 16;
                  }
                  else
                  {
                     // Go through the index hole
                     unsigned char return_value = 0;

                     for (int i = 0; i < 16; i += 2)
                     {
                        int readoffset;
                        return_value <<= 1;
                        if (index >= side_[side].tracks[track].revolution[rev].size)
                        {
                           readoffset = index % side_[side].tracks[track].revolution[rev].size;
                        }
                        else
                        {
                           readoffset = index;
                        }
                        unsigned char b = side_[side].tracks[track].revolution[rev].bitfield[readoffset];
                        index += 2;
                        return_value |= b & 0x1;
                     }
                     crc_local.AddByteToCrc(return_value);
                     sector.real_size++;
                     //index = readoffset;
                  }
               }
               if (index < side_[side].tracks[track].revolution[rev].size - 32)
               {
                  // CRC Check
                  crc = GetNextByteForRev(side, track, index, rev);
                  crc <<= 8;
                  index += 16;
                  crc |= GetNextByteForRev(side, track, index, rev);
                  index += 16;
               }
               else
               {
                  crc = 0;

                  for (int i = 0; i < 32; i += 2)
                  {
                     int readoffset;
                     crc <<= 1;
                     if (index >= side_[side].tracks[track].revolution[rev].size)
                     {
                        readoffset = index % side_[side].tracks[track].revolution[rev].size;
                     }
                     else
                     {
                        readoffset = index;
                     }
                     unsigned char b = side_[side].tracks[track].revolution[rev].bitfield[readoffset];
                     index += 2;
                     crc |= b & 0x1;
                  }

                  //
                  LOG("Track size is too small ?!!");
               }
               // Set status 1
               if (crc != crc_local.GetCRC())
               {
                  sector.data_crc_ok = false;
                  sector.status1 |= 0x20;
                  sector.status2 |= 0x20;
                  LOG("DATA CRC ERROR !");
               }
               else
               {
                  sector.data_crc_ok = true;
               }
               LOGEOL
               // Keep this to compute GAP3 size
               sector.index_end = index;

               if (index < side_[side].tracks[track].revolution[rev].size - 16)
               {
                  // End of sector. Look at the GAP until Sync is found - Only get it if different from 0x4E
                  byte = GetNextByteForRev(side, track, index, rev);
                  if (byte != 0x4E && byte != 0x4B)
                  {
                     sector.real_size += 2; // Add CRC + first gap

                     while ((memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                                    sizeof(pattern_f)) != 0)
                        && (index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_f)))
                     {
                        index += 16;
                        ++sector.real_size;
                        /*byte = GetNextByteForRev (side, track, index );
                        index += 16;*/
                     }
                  }
               }

               // NOTE : It can be a bit misalign, so sync bytes are watched on a bit basis
               // TODO

               track_buffer->list_sector_.push_back(sector);

               size += sector.real_size;

               // Adaptation: rewind to sector.DAMOffset to avoid forgetting interlaced sectors
               //index = sector.DAMOffset + 64 + 1;
               index = sector.idam_offset + 64 + 1;
            }
            else
            {
               ++index;
            }
         }

         // Next sector
      }
      else
      {
         ++index;
      }
   }

   // Avegare GAP3 size :
   int gap_3_total = 0;
   int offset_end = 0;
   if (track_buffer->list_sector_.size() > 0)
   {
      for (unsigned int i = 0; i < track_buffer->list_sector_.size(); i++)
      {
         if (i > 0)
         {
            gap_3_total += track_buffer->list_sector_[i].idam_offset - 24 - offset_end;
         }
         offset_end = track_buffer->list_sector_[i].index_end;
      }
      //gap_3_total += side_[side].Tracks[track].Revolution[0].Size - offset_end;

      track_buffer->gap3_size_ = gap_3_total / 16 / track_buffer->list_sector_.size();

      if ((size & 0xFFFFFF00) < size)
      {
         size += 0x100;
      }
      track_buffer->full_size_ = size;
   }
   else
   {
      track_buffer->full_size_ = 0;
   }


   // TODO : Compute real size of track
   return size;
}